

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O2

float verify_accuracy<float,sumlib::kahan,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                (undefined8 *param_1)

{
  ulong uVar1;
  ulong *puVar2;
  pointer pfVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vector<float,_std::allocator<float>_> numbers;
  float local_84;
  float local_80;
  float local_7c;
  normal_distribution<float> local_78;
  _Vector_base<float,_std::allocator<float>_> local_68;
  ulong *local_48;
  ulong local_40;
  ulong *local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (float *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (ulong *)*param_1;
  local_48 = (ulong *)param_1[1];
  local_84 = 0.0;
  while (puVar2 != local_48) {
    local_40 = *puVar2;
    uVar1 = puVar2[1];
    local_78._M_param._M_stddev = *(float *)(puVar2 + 2);
    local_78._M_param._M_mean = 0.0;
    local_78._M_saved = 0.0;
    local_78._M_saved_available = false;
    uVar4 = local_40 >> 1;
    fVar6 = (float)(long)uVar1;
    local_38 = puVar2;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      local_7c = std::normal_distribution<float>::operator()
                           (&local_78,
                            (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                             *)&stack0x00000008);
      local_80 = local_7c + fVar6;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                ((vector<float,_std::allocator<float>_> *)&local_68,&local_80);
      local_80 = fVar6 - local_7c;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                ((vector<float,_std::allocator<float>_> *)&local_68,&local_80);
    }
    local_84 = local_84 + (float)(uVar1 * local_40);
    puVar2 = local_38 + 3;
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_68._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_68._M_impl.super__Vector_impl_data._M_finish,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&stack0x00000008);
  fVar7 = 0.0;
  fVar6 = 0.0;
  for (pfVar3 = local_68._M_impl.super__Vector_impl_data._M_start;
      pfVar3 != local_68._M_impl.super__Vector_impl_data._M_finish; pfVar3 = pfVar3 + 1) {
    fVar8 = fVar6 + (*pfVar3 - fVar7);
    fVar7 = (fVar8 - fVar6) - (*pfVar3 - fVar7);
    fVar6 = fVar8;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
  return fVar6 - local_84;
}

Assistant:

T verify_accuracy( vector<distribution<T>> dists, RNG rng ) {
    vector<T> numbers;
    T total = 0;
    for( distribution<T> d : dists ) {
        normal_distribution<T> nd( 0, d.deviation );

        for( uint64_t i = 0; i < (d.terms/2); i++ ) {
            T deviation = nd( rng );
            numbers.push_back( d.mean + deviation );
            numbers.push_back( d.mean - deviation );
        }

        total += d.terms * d.mean;
    }

    shuffle( numbers.begin(), numbers.end(), rng );

    SUMMER<T> sum;
    for( auto x : numbers )
        sum += x;

    return sum.get()-total;
}